

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void __thiscall ThreadParser::domCheckSum(ThreadParser *this,DOMNode *node)

{
  undefined4 uVar1;
  long *plVar2;
  ulong uVar3;
  DOMNode *node_00;
  XMLCh *pXVar4;
  ulong local_40;
  XMLSize_t i;
  XMLSize_t numAttributes;
  DOMNamedNodeMap *attributes;
  DOMNode *child;
  XMLCh *s;
  DOMNode *node_local;
  ThreadParser *this_local;
  
  uVar1 = (**(code **)(*(long *)node + 0x20))();
  switch(uVar1) {
  case 1:
    pXVar4 = (XMLCh *)(**(code **)(*(long *)node + 0x10))();
    plVar2 = (long *)(**(code **)(*(long *)node + 0x58))();
    uVar3 = (**(code **)(*plVar2 + 0x28))();
    for (local_40 = 0; local_40 < uVar3; local_40 = local_40 + 1) {
      node_00 = (DOMNode *)(**(code **)(*plVar2 + 0x18))(plVar2,local_40);
      domCheckSum(this,node_00);
    }
    addToCheckSum(this,pXVar4,0xffffffffffffffff);
    for (attributes = (DOMNamedNodeMap *)(**(code **)(*(long *)node + 0x38))();
        attributes != (DOMNamedNodeMap *)0x0;
        attributes = (DOMNamedNodeMap *)(**(code **)(*(long *)attributes + 0x50))()) {
      domCheckSum(this,(DOMNode *)attributes);
    }
    break;
  case 2:
    pXVar4 = (XMLCh *)(**(code **)(*(long *)node + 0x10))();
    addToCheckSum(this,pXVar4,0xffffffffffffffff);
    pXVar4 = (XMLCh *)(**(code **)(*(long *)node + 0x18))();
    if (pXVar4 != (XMLCh *)0x0) {
      addToCheckSum(this,pXVar4,0xffffffffffffffff);
    }
    break;
  case 3:
  case 4:
    pXVar4 = (XMLCh *)(**(code **)(*(long *)node + 0x18))();
    addToCheckSum(this,pXVar4,0xffffffffffffffff);
    break;
  case 5:
  case 9:
    for (attributes = (DOMNamedNodeMap *)(**(code **)(*(long *)node + 0x38))();
        attributes != (DOMNamedNodeMap *)0x0;
        attributes = (DOMNamedNodeMap *)(**(code **)(*(long *)attributes + 0x50))()) {
      domCheckSum(this,(DOMNode *)attributes);
    }
    break;
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  }
  return;
}

Assistant:

void ThreadParser::domCheckSum(const DOMNode *node)
{
    const XMLCh        *s;
    DOMNode          *child;
    DOMNamedNodeMap  *attributes;

    switch (node->getNodeType() )
    {
    case DOMNode::ELEMENT_NODE:
        {
            s = node->getNodeName();   // the element name

            attributes = node->getAttributes();  // Element's attributes
            XMLSize_t numAttributes = attributes->getLength();
            XMLSize_t i;
            for (i=0; i<numAttributes; i++)
                domCheckSum(attributes->item(i));

            addToCheckSum(s);          // Content and Children
            for (child=node->getFirstChild(); child!=0; child=child->getNextSibling())
                domCheckSum(child);

            break;
        }

    case DOMNode::ATTRIBUTE_NODE:
        {
            s = node->getNodeName();  // The attribute name
            addToCheckSum(s);
            s = node->getNodeValue();  // The attribute value
            if (s != 0)
                addToCheckSum(s);
            break;
        }

    case DOMNode::TEXT_NODE:
    case DOMNode::CDATA_SECTION_NODE:
        {
            s = node->getNodeValue();
            addToCheckSum(s);
            break;
        }

    case DOMNode::ENTITY_REFERENCE_NODE:
    case DOMNode::DOCUMENT_NODE:
        {
            // For entity references and the document, nothing is dirctly
            //  added to the checksum, but we do want to process the chidren nodes.
            //
            for (child=node->getFirstChild(); child!=0; child=child->getNextSibling())
                domCheckSum(child);
            break;
        }
    case DOMNode::ENTITY_NODE:
    case DOMNode::PROCESSING_INSTRUCTION_NODE:
    case DOMNode::COMMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::NOTATION_NODE:
        break;
    }
}